

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O2

fourcc_t EBML_BufferToID(uint8_t *Buffer)

{
  byte bVar1;
  uint uVar2;
  long lStack_8;
  
  uVar2 = 0;
  if (Buffer != (uint8_t *)0x0) {
    bVar1 = *Buffer;
    if ((char)bVar1 < '\0') {
      return (uint)bVar1;
    }
    if (bVar1 < 0x40) {
      if (bVar1 < 0x20) {
        if (bVar1 < 0x10) {
          return 0;
        }
        uVar2 = (uint)Buffer[2] << 8 | (uint)Buffer[1] << 0x10 | (uint)bVar1 << 0x18;
        lStack_8 = 3;
      }
      else {
        uVar2 = (uint)bVar1 << 0x10 | (uint)Buffer[1] << 8;
        lStack_8 = 2;
      }
    }
    else {
      uVar2 = (uint)bVar1 << 8;
      lStack_8 = 1;
    }
    uVar2 = Buffer[lStack_8] | uVar2;
  }
  return uVar2;
}

Assistant:

fourcc_t EBML_BufferToID(const uint8_t *Buffer)
{
    if (Buffer == NULL)
        return 0;
    if (Buffer[0] & 0x80)
        return (fourcc_t)Buffer[0];
    if (Buffer[0] & 0x40)
        return (fourcc_t)((Buffer[0] << 8) + Buffer[1]);
    if (Buffer[0] & 0x20)
        return (fourcc_t)((Buffer[0] << 16) + (Buffer[1] << 8) + Buffer[2]);
    if (Buffer[0] & 0x10)
        return (fourcc_t)((Buffer[0] << 24) + (Buffer[1] << 16) + (Buffer[2] << 8) + Buffer[3]);
    return 0;
}